

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O1

int __thiscall base_uint<256U>::CompareTo(base_uint<256U> *this,base_uint<256U> *b)

{
  uint uVar1;
  int iVar2;
  long in_FS_OFFSET;
  bool bVar3;
  
  uVar1 = 7;
  while( true ) {
    if (this->pn[uVar1] < b->pn[uVar1]) {
      iVar2 = -1;
      goto LAB_0015607e;
    }
    if (b->pn[uVar1] < this->pn[uVar1]) break;
    bVar3 = uVar1 == 0;
    uVar1 = uVar1 - 1;
    if (bVar3) {
      iVar2 = 0;
LAB_0015607e:
      if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
        return iVar2;
      }
      __stack_chk_fail();
    }
  }
  iVar2 = 1;
  goto LAB_0015607e;
}

Assistant:

int base_uint<BITS>::CompareTo(const base_uint<BITS>& b) const
{
    for (int i = WIDTH - 1; i >= 0; i--) {
        if (pn[i] < b.pn[i])
            return -1;
        if (pn[i] > b.pn[i])
            return 1;
    }
    return 0;
}